

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O0

curi_status
parse_dec_octet(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData)

{
  size_t sVar1;
  curi_status cVar2;
  int iVar3;
  ulong local_50;
  size_t i;
  size_t previousOffset;
  char numberStr [4];
  int number;
  void *userData_local;
  curi_settings *settings_local;
  size_t *offset_local;
  size_t len_local;
  char *uri_local;
  
  _numberStr = userData;
  memset(&previousOffset,0,4);
  local_50 = 0;
  do {
    if (2 < local_50) {
LAB_002600d2:
      iVar3 = atoi((char *)&previousOffset);
      if ((iVar3 < 0) || (0xff < iVar3)) {
        uri_local._4_4_ = curi_status_error;
      }
      else {
        uri_local._4_4_ = curi_status_success;
      }
      return uri_local._4_4_;
    }
    sVar1 = *offset;
    cVar2 = parse_digit(uri,len,offset,settings,_numberStr);
    if (cVar2 != curi_status_success) {
      *offset = sVar1;
      goto LAB_002600d2;
    }
    numberStr[local_50 - 8] = uri[sVar1];
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

static curi_status parse_dec_octet(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData)
{
    // dec-octet = DIGIT                 ; 0-9
    //           / %x31-39 DIGIT         ; 10-99
    //           / "1" 2DIGIT            ; 100-199
    //           / "2" %x30-34 DIGIT     ; 200-249
    //           / "25" %x30-35          ; 250-255
    int number;
    char numberStr[4] = {'\0', '\0', '\0', '\0'};
    size_t previousOffset;
    size_t i;

    for (i = 0 ; i < 3 ; ++i)
    {
        previousOffset = *offset;
        if (parse_digit(uri, len, offset, settings, userData) !=  curi_status_success)
        {
            *offset = previousOffset;
            break;
        }
        numberStr[i] = uri[previousOffset];
    }

    number = atoi(numberStr);
    if (number >= 0 && number <= 255)
        return curi_status_success;
    else
        return curi_status_error;
}